

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O0

bool __thiscall
FirewirePort::WriteQuadletNode
          (FirewirePort *this,nodeid_t node,nodeaddr_t addr,quadlet_t data,uchar param_4)

{
  bool bVar1;
  int iVar2;
  ushort local_68;
  nodeid_t curNode;
  bool ret;
  allocator<char> local_51;
  string local_50 [35];
  uchar local_2d;
  quadlet_t local_2c;
  uchar param_4_local;
  nodeaddr_t nStack_28;
  quadlet_t data_local;
  nodeaddr_t addr_local;
  FirewirePort *pFStack_18;
  nodeid_t node_local;
  FirewirePort *this_local;
  
  local_2d = param_4;
  local_2c = data;
  nStack_28 = addr;
  addr_local._6_2_ = node;
  pFStack_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"FirewirePort::WriteQuadlet",&local_51);
  iVar2 = (*(this->super_BasePort)._vptr_BasePort[0x1b])(this,local_50,0);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  if ((((byte)iVar2 ^ 0xff) & 1) == 0) {
    local_2c = __bswap_32(local_2c);
    iVar2 = raw1394_write(this->handle,this->baseNodeId + addr_local._6_2_,nStack_28,4,&local_2c);
    this_local._7_1_ = iVar2 == 0;
    if ((!this_local._7_1_) && (addr_local._6_2_ == 0x3f)) {
      bVar1 = true;
      for (local_68 = 0; this_local._7_1_ = bVar1,
          (uint)local_68 < (this->super_BasePort).NumOfNodes_; local_68 = local_68 + 1) {
        iVar2 = raw1394_write(this->handle,this->baseNodeId + local_68,nStack_28,4,&local_2c);
        if (iVar2 != 0) {
          bVar1 = false;
        }
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FirewirePort::WriteQuadletNode(nodeid_t node, nodeaddr_t addr, quadlet_t data, unsigned char)
{
    if (!CheckFwBusGeneration("FirewirePort::WriteQuadlet"))
        return false;

    data = bswap_32(data);
    bool ret = !raw1394_write(handle, baseNodeId+node, addr, 4, &data);

    // Workaround for Firewire broadcast, which is not currently working due to an issue with
    // either libraw1394 or the Firewire JuJu driver.
    if (!ret && (node == FW_NODE_BROADCAST)) {
        ret = true;
        for (nodeid_t curNode = 0; curNode < NumOfNodes_; curNode++) {
            if (raw1394_write(handle, baseNodeId+curNode, addr, 4, &data))
                ret = false;
        }
    }

    return ret;
}